

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicksort.c
# Opt level: O2

void quicksort(string *a,size_t n)

{
  undefined1 auVar1 [16];
  uchar *s2;
  string puVar2;
  int pb;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  
LAB_001d38b8:
  if (n < 10) {
    for (uVar12 = 1; uVar16 = uVar12, uVar12 < n; uVar12 = uVar12 + 1) {
      while ((0 < (long)uVar16 && (iVar6 = scmp(a[uVar16 - 1],a[uVar16]), 0 < iVar6))) {
        auVar1 = *(undefined1 (*) [16])(a + (uVar16 - 1));
        auVar17._0_8_ = auVar1._8_8_;
        auVar17._8_4_ = auVar1._0_4_;
        auVar17._12_4_ = auVar1._4_4_;
        *(undefined1 (*) [16])(a + (uVar16 - 1)) = auVar17;
        uVar16 = uVar16 - 1;
      }
    }
    return;
  }
  iVar4 = (int)(n >> 1);
  iVar6 = (int)n;
  uVar13 = iVar6 - 1;
  uVar8 = 0;
  if (n < 0x29) {
    iVar3 = 0;
    uVar5 = uVar13;
  }
  else {
    pb = (int)(n >> 3);
    iVar3 = med3(0,pb,pb * 2,a);
    iVar4 = med3(iVar4 - pb,iVar4,iVar4 + pb,a);
    uVar5 = med3(uVar13 + pb * -2,uVar13 - pb,uVar13,a);
  }
  iVar4 = med3(iVar3,iVar4,uVar5,a);
  s2 = a[iVar4];
  lVar7 = 0;
  uVar5 = uVar13;
  do {
    lVar15 = (long)(int)lVar7;
    lVar10 = (long)(int)uVar13;
    lVar11 = lVar10 + 1;
    if (lVar10 + 1 <= lVar15) {
      lVar11 = lVar15;
    }
    for (; lVar7 = lVar11, lVar11 != lVar15; lVar15 = lVar15 + 1) {
      iVar4 = scmp(a[lVar15],s2);
      lVar7 = lVar15;
      if (0 < iVar4) break;
      if (iVar4 == 0) {
        puVar2 = a[(int)uVar8];
        a[(int)uVar8] = a[lVar15];
        a[lVar15] = puVar2;
        uVar8 = uVar8 + 1;
      }
    }
    iVar4 = (int)lVar7;
    lVar15 = (long)iVar4;
    uVar13 = -uVar13;
    lVar11 = lVar10 << 0x20;
    while( true ) {
      if (lVar10 < lVar15) {
        uVar14 = iVar4 - uVar8;
        if ((int)uVar14 <= (int)uVar8) {
          uVar8 = uVar14;
        }
        vecswap(0,iVar4 - uVar8,uVar8,a);
        uVar9 = uVar5 + uVar13;
        uVar8 = ~uVar5 + iVar6;
        if ((int)uVar9 < (int)(~uVar5 + iVar6)) {
          uVar8 = uVar9;
        }
        vecswap(iVar4,iVar6 - uVar8,uVar8,a);
        if (1 < (int)uVar14) {
          quicksort(a,(ulong)uVar14);
        }
        if ((int)uVar9 < 2) {
          return;
        }
        a = a + (int)((iVar6 - uVar5) - uVar13);
        n = (size_t)uVar9;
        goto LAB_001d38b8;
      }
      iVar3 = scmp(a[lVar10],s2);
      if (iVar3 < 0) break;
      if (iVar3 == 0) {
        puVar2 = a[lVar10];
        a[lVar10] = a[(int)uVar5];
        a[(int)uVar5] = puVar2;
        uVar5 = uVar5 - 1;
      }
      lVar10 = lVar10 + -1;
      uVar13 = uVar13 + 1;
      lVar11 = lVar11 + -0x100000000;
    }
    puVar2 = a[lVar15];
    a[lVar15] = *(string *)((long)a + (lVar11 >> 0x1d));
    *(string *)((long)a + (lVar11 >> 0x1d)) = puVar2;
    lVar7 = lVar7 + 1;
    uVar13 = ~uVar13;
  } while( true );
}

Assistant:

void quicksort(string a[], size_t n)
{
   int pa, pb, pc, pd, pl, pm, pn, r, s;
   string t;
   string pv;

   if (n < 10) {       /* Insertion sort on smallest arrays */
      for (pm = 1; pm < n; pm++)
         for (pl = pm; pl > 0 && scmp(a[pl-1], a[pl]) > 0; pl--)
            swap(a[pl], a[pl-1]);
      return;
   }
   pm = n/2;               /* Small arrays, middle element */
   if (n > 7) {
      pl = 0;
      pn = n-1;
      if (n > 40) {       /* Big arrays, pseudomedian of 9 */
         s = n/8;
         pl = med3(pl, pl+s, pl+2*s, a);
         pm = med3(pm-s, pm, pm+s, a);
         pn = med3(pn-2*s, pn-s, pn, a);
      }
      pm = med3(pl, pm, pn, a);      /* Mid-size, med of 3 */
   }
   pv = a[pm];
   pa = pb = 0;
   pc = pd = n-1;
   for (;;) {
      while (pb <= pc && (r = scmp(a[pb], pv)) <= 0) {
         if (r == 0) { swap(a[pa], a[pb]); pa++; }
         pb++;
      }
      while (pc >= pb && (r = scmp(a[pc], pv)) >= 0) {
         if (r == 0) { swap(a[pc], a[pd]); pd--; }
         pc--;
      }
      if (pb > pc) break;
      swap(a[pb], a[pc]);
      pb++;
      pc--;
   }
   pn = n;
   s = min(pa,  pb-pa   ); vecswap(0,  pb-s, s, a);
   s = min(pd-pc, pn-pd-1); vecswap(pb, pn-s, s, a);
   if ((s = pb-pa) > 1) quicksort(a,    s);
   if ((s = pd-pc) > 1) quicksort(&a[pn-s], s);
}